

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_SetAddCut(Nf_Cut_t **pCuts,int nCuts,int nCutNum)

{
  Nf_Cut_t *pNVar1;
  Nf_Cut_t *pNVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  int i;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  
  if (nCuts == 0) {
    return 1;
  }
  lVar12 = (long)nCuts;
  uVar10 = 0;
  uVar11 = 0;
  if (0 < nCuts) {
    uVar11 = (ulong)(uint)nCuts;
  }
  bVar3 = false;
  for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
    pNVar1 = pCuts[lVar12];
    pNVar2 = pCuts[uVar10];
    if (((*(uint *)&pNVar1->field_0x10 >> 0x1b < *(uint *)&pNVar2->field_0x10 >> 0x1b) &&
        ((pNVar1->Sign & ~pNVar2->Sign) == 0)) &&
       (iVar4 = Nf_SetCutIsContainedOrder(pNVar2,pNVar1), iVar4 != 0)) {
      *(uint *)&pCuts[uVar10]->field_0x10 = *(uint *)&pCuts[uVar10]->field_0x10 | 0xf8000000;
      bVar3 = true;
    }
  }
  uVar5 = nCuts;
  if (bVar3) {
    lVar7 = -1;
    if (-1 < lVar12) {
      lVar7 = lVar12;
    }
    iVar4 = 0;
    for (lVar12 = 0; lVar7 + 1 != lVar12; lVar12 = lVar12 + 1) {
      if (*(uint *)&pCuts[lVar12]->field_0x10 < 0xf8000000) {
        lVar6 = (long)iVar4;
        if (lVar6 < lVar12) {
          pNVar1 = pCuts[lVar6];
          pCuts[lVar6] = pCuts[lVar12];
          pCuts[lVar12] = pNVar1;
        }
        iVar4 = iVar4 + 1;
      }
    }
    nCuts = iVar4 - 1;
    uVar5 = nCuts;
  }
  for (; 0 < nCuts; nCuts = nCuts - 1) {
    pNVar1 = pCuts[(ulong)(uint)nCuts - 1];
    pNVar2 = pCuts[(uint)nCuts];
    uVar8 = *(uint *)&pNVar1->field_0x10 >> 0x1a & 1;
    uVar9 = *(uint *)&pNVar2->field_0x10 >> 0x1a & 1;
    if (uVar8 < uVar9) break;
    if (uVar8 <= uVar9) {
      if (pNVar1->Flow < pNVar2->Flow) break;
      if (pNVar1->Flow <= pNVar2->Flow) {
        if ((pNVar1->Delay < pNVar2->Delay) ||
           ((pNVar1->Delay <= pNVar2->Delay &&
            (*(uint *)&pNVar1->field_0x10 >> 0x1b < *(uint *)&pNVar2->field_0x10 >> 0x1b)))) break;
      }
    }
    pCuts[(ulong)(uint)nCuts - 1] = pNVar2;
    pCuts[(uint)nCuts] = pNVar1;
  }
  iVar4 = nCutNum + -1;
  if ((int)(uVar5 + 1) < nCutNum + -1) {
    iVar4 = uVar5 + 1;
  }
  return iVar4;
}

Assistant:

static inline int Nf_SetAddCut( Nf_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Nf_SetLastCutContainsArea(pCuts, nCuts);
    Nf_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}